

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDress2.c
# Opt level: O3

void Abc_NtkDress2Transfer(Abc_Ntk_t *pNtk0,Abc_Ntk_t *pNtk1,Vec_Ptr_t *vRes,int fVerbose)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  Abc_Obj_t *pObj;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  void *pvVar11;
  
  if (vRes->nSize < 1) {
    iVar3 = 0;
    iVar2 = 0;
  }
  else {
    lVar10 = 0;
    iVar2 = 0;
    iVar3 = 0;
    do {
      lVar4 = (long)*(int *)((long)vRes->pArray[lVar10] + 4);
      if (0 < lVar4) {
        lVar9 = 0;
        pObj = (Abc_Obj_t *)0x0;
        uVar7 = 0;
        uVar6 = 0;
        pvVar11 = (void *)0x0;
        do {
          uVar1 = *(uint *)(*(long *)((long)vRes->pArray[lVar10] + 8) + lVar9 * 4);
          uVar8 = (int)uVar1 >> 2;
          if ((uVar1 & 1) == 0) {
            if (((int)uVar8 < 0) || (pNtk0->vObjs->nSize <= (int)uVar8)) {
LAB_002ace96:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            pObj = (Abc_Obj_t *)pNtk0->vObjs->pArray[uVar8];
            uVar6 = uVar1 >> 1 & 1;
          }
          else {
            if (((int)uVar8 < 0) || (pNtk1->vObjs->nSize <= (int)uVar8)) goto LAB_002ace96;
            pvVar11 = pNtk1->vObjs->pArray[uVar8];
            uVar7 = uVar1 >> 1 & 1;
          }
          lVar9 = lVar9 + 1;
        } while (lVar4 != lVar9);
        if ((((pObj != (Abc_Obj_t *)0x0) && (pvVar11 != (void *)0x0)) &&
            (pcVar5 = Nm_ManFindNameById(pNtk0->pManName,pObj->Id), pcVar5 == (char *)0x0)) &&
           (pcVar5 = Nm_ManFindNameById(pNtk1->pManName,*(int *)((long)pvVar11 + 0x10)),
           pcVar5 != (char *)0x0)) {
          if (uVar6 == uVar7) {
            Abc_ObjAssignName(pObj,pcVar5,(char *)0x0);
            iVar2 = iVar2 + 1;
          }
          else {
            Abc_ObjAssignName(pObj,pcVar5,"_inv");
            iVar3 = iVar3 + 1;
          }
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < vRes->nSize);
  }
  if (fVerbose == 0) {
    return;
  }
  printf("Total number of names assigned  = %5d. (Dir = %5d. Compl = %5d.)\n",
         (ulong)(uint)(iVar2 + iVar3));
  return;
}

Assistant:

void Abc_NtkDress2Transfer( Abc_Ntk_t * pNtk0, Abc_Ntk_t * pNtk1, Vec_Ptr_t * vRes, int fVerbose )
{
    Vec_Int_t * vClass;
    Abc_Obj_t * pObj0, * pObj1;
    int i, k, fComp0, fComp1, Entry;
    int CounterInv = 0, Counter = 0;
    char * pName;
    Vec_PtrForEachEntry( Vec_Int_t *, vRes, vClass, i )
    {
        pObj0 = pObj1 = NULL;
        fComp0 = fComp1 = 0;
        Vec_IntForEachEntry( vClass, Entry, k )
        {
            if ( Abc_ObjEquivId2NtkId(Entry) )
            {
                pObj1 = Abc_NtkObj( pNtk1, Abc_ObjEquivId2ObjId(Entry) );
                fComp1 = Abc_ObjEquivId2Polar(Entry);
            }
            else
            {
                pObj0 = Abc_NtkObj( pNtk0, Abc_ObjEquivId2ObjId(Entry) );
                fComp0 = Abc_ObjEquivId2Polar(Entry);
            }
        }
        if ( pObj0 == NULL || pObj1 == NULL )
            continue;
        // if the node already has a name, quit
        pName = Nm_ManFindNameById( pNtk0->pManName, pObj0->Id );
        if ( pName != NULL )
            continue;
        // if the other node has no name, quit
        pName = Nm_ManFindNameById( pNtk1->pManName, pObj1->Id );
        if ( pName == NULL )
            continue;
        // assign name
        if ( fComp0 ^ fComp1 )
        {
            Abc_ObjAssignName( pObj0, pName, "_inv" );
            CounterInv++;
        }
        else
        {
            Abc_ObjAssignName( pObj0, pName, NULL );
            Counter++;
        }
    }
    if ( fVerbose )
    {
        printf( "Total number of names assigned  = %5d. (Dir = %5d. Compl = %5d.)\n", 
            Counter + CounterInv, Counter, CounterInv );
    }
}